

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O3

ClipLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_clip(NeuralNetworkLayer *this)

{
  LayerUnion this_00;
  
  if (this->_oneof_case_[0] == 0x294) {
    this_00 = this->layer_;
  }
  else {
    clear_layer(this);
    this->_oneof_case_[0] = 0x294;
    this_00.convolution_ = (ConvolutionLayerParams *)operator_new(0x20);
    ClipLayerParams::ClipLayerParams(this_00.clip_);
    (this->layer_).clip_ = (ClipLayerParams *)this_00;
  }
  return (ClipLayerParams *)this_00.convolution_;
}

Assistant:

inline ::CoreML::Specification::ClipLayerParams* NeuralNetworkLayer::mutable_clip() {
  if (!has_clip()) {
    clear_layer();
    set_has_clip();
    layer_.clip_ = new ::CoreML::Specification::ClipLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.clip)
  return layer_.clip_;
}